

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O0

_Bool csp_conn_is_active(csp_conn_t *conn)

{
  csp_conn_t *in_RDI;
  _Bool local_1;
  
  if ((((in_RDI->idin).flags & 2) == 0) && (((in_RDI->idout).flags & 2) == 0)) {
    local_1 = true;
  }
  else {
    local_1 = csp_rdp_conn_is_active(in_RDI);
  }
  return local_1;
}

Assistant:

bool csp_conn_is_active(csp_conn_t *conn) {
#if (CSP_USE_RDP)
	if ((conn->idin.flags & CSP_FRDP) || (conn->idout.flags & CSP_FRDP)) {
		/* This is for sure an RDP connection */
		return csp_rdp_conn_is_active(conn);
	}
#endif

	/* Non RDP connections are always "active" */
	return true;
}